

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O3

Precision * __thiscall
icu_63::number::IncrementPrecision::withMinFraction
          (Precision *__return_storage_ptr__,IncrementPrecision *this,int32_t minFrac)

{
  FractionSignificantSettings FVar1;
  UNumberFormatRoundingMode UVar2;
  undefined4 uVar3;
  PrecisionType PVar4;
  undefined4 uVar5;
  bool sign;
  int32_t point;
  int32_t length;
  char buffer [18];
  bool local_49;
  double local_48;
  short local_40 [2];
  short local_3c [2];
  char local_38 [24];
  
  if ((this->super_Precision).fType == RND_ERROR) {
    PVar4 = (this->super_Precision).fType;
    uVar5 = *(undefined4 *)&(this->super_Precision).field_0x4;
    FVar1 = (this->super_Precision).fUnion.fracSig;
    UVar2 = (this->super_Precision).fRoundingMode;
    uVar3 = *(undefined4 *)&(this->super_Precision).field_0x1c;
    *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) =
         *(undefined8 *)((long)&(this->super_Precision).fUnion + 8);
    __return_storage_ptr__->fRoundingMode = UVar2;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar3;
    __return_storage_ptr__->fType = PVar4;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar5;
    (__return_storage_ptr__->fUnion).fracSig = FVar1;
  }
  else if ((uint)minFrac < 1000) {
    local_48 = (this->super_Precision).fUnion.increment.fIncrement;
    double_conversion::DoubleToStringConverter::DoubleToAscii
              (local_48,SHORTEST,0,local_38,0x12,&local_49,(int *)local_3c,(int *)local_40);
    __return_storage_ptr__->fType = RND_INCREMENT;
    (__return_storage_ptr__->fUnion).increment.fIncrement = local_48;
    (__return_storage_ptr__->fUnion).increment.fMinFrac = (digits_t)minFrac;
    (__return_storage_ptr__->fUnion).increment.fMaxFrac = local_3c[0] - local_40[0];
    __return_storage_ptr__->fRoundingMode = UNUM_FOUND_HALFEVEN;
  }
  else {
    __return_storage_ptr__->fType = RND_ERROR;
    (__return_storage_ptr__->fUnion).currencyUsage = 0x10112;
  }
  return __return_storage_ptr__;
}

Assistant:

Precision IncrementPrecision::withMinFraction(int32_t minFrac) const {
    if (fType == RND_ERROR) { return *this; } // no-op in error state
    if (minFrac >= 0 && minFrac <= kMaxIntFracSig) {
        return constructIncrement(fUnion.increment.fIncrement, minFrac);
    } else {
        return {U_NUMBER_ARG_OUTOFBOUNDS_ERROR};
    }
}